

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool __thiscall tinyxml2::XMLDocument::Accept(XMLDocument *this,XMLVisitor *visitor)

{
  XMLNode *pXVar1;
  int iVar2;
  XMLNode **ppXVar3;
  
  iVar2 = (*visitor->_vptr_XMLVisitor[2])(visitor,this);
  if ((char)iVar2 != '\0') {
    ppXVar3 = &(this->super_XMLNode)._firstChild;
    do {
      pXVar1 = *ppXVar3;
      if (pXVar1 == (XMLNode *)0x0) break;
      iVar2 = (*pXVar1->_vptr_XMLNode[0xe])(pXVar1,visitor);
      ppXVar3 = &pXVar1->_next;
    } while ((char)iVar2 != '\0');
  }
  iVar2 = (*visitor->_vptr_XMLVisitor[3])(visitor,this);
  return SUB41(iVar2,0);
}

Assistant:

bool XMLDocument::Accept(XMLVisitor* visitor) const
{
    TIXMLASSERT(visitor);
    if (visitor->VisitEnter(*this)) {
        for (const XMLNode* node = FirstChild(); node; node = node->NextSibling()) {
            if (!node->Accept(visitor)) {
                break;
            }
        }
    }
    return visitor->VisitExit(*this);
}